

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlRemoveID(xmlDocPtr doc,xmlAttrPtr attr)

{
  xmlHashTablePtr table;
  xmlChar *name;
  void *pvVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((attr != (xmlAttrPtr)0x0 && doc != (xmlDocPtr)0x0) &&
     (table = (xmlHashTablePtr)doc->ids, table != (xmlHashTablePtr)0x0)) {
    name = xmlNodeListGetString(doc,attr->children,1);
    if (name != (xmlChar *)0x0) {
      pvVar1 = xmlHashLookup(table,name);
      if ((pvVar1 == (void *)0x0) || (*(xmlAttrPtr *)((long)pvVar1 + 0x10) != attr)) {
        (*xmlFree)(name);
      }
      else {
        xmlHashRemoveEntry(table,name,xmlFreeIDTableEntry);
        (*xmlFree)(name);
        attr->atype = 0;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
xmlRemoveID(xmlDocPtr doc, xmlAttrPtr attr) {
    xmlIDTablePtr table;
    xmlIDPtr id;
    xmlChar *ID;

    if (doc == NULL) return(-1);
    if (attr == NULL) return(-1);

    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)
        return(-1);

    ID = xmlNodeListGetString(doc, attr->children, 1);
    if (ID == NULL)
        return(-1);

    id = xmlHashLookup(table, ID);
    if (id == NULL || id->attr != attr) {
        xmlFree(ID);
        return(-1);
    }

    xmlHashRemoveEntry(table, ID, xmlFreeIDTableEntry);
    xmlFree(ID);
    attr->atype = 0;
    return(0);
}